

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<false,_false,_false>::excheck_
          (DaTrie<false,_false,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  uint32_t uVar4;
  uint base;
  
  uVar4 = this->head_pos_;
  if (uVar4 != 0xffffffff) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (uVar4 < (int)((ulong)((long)pBVar1 - (long)pBVar2) >> 3) - 0x100U) {
        base = edge->labels_[0] ^ uVar4;
        bVar3 = is_target_ex_(this,base,edge);
        if (bVar3) {
          this->head_pos_ = uVar4;
          return base;
        }
      }
      uVar4 = *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar4) & 0x7fffffff;
    } while (uVar4 != this->head_pos_);
  }
  return 0xffffffff;
}

Assistant:

uint32_t excheck_(const Edge& edge, const std::vector<Block>& blocks) {
    if (head_pos_ == NOT_FOUND) {
      return NOT_FOUND;
    }

    auto upper_limit = bc_size() - BLOCK_SIZE;
    auto node_pos = head_pos_;

    do {
      if (upper_limit <= node_pos) {
        continue;
      }
      auto base = node_pos ^*edge.begin();
      if (is_target_ex_(base, edge)) {
        head_pos_ = node_pos; // update for remaining
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head_pos_);

    return NOT_FOUND;
  }